

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_pixarlog.c
# Opt level: O0

int PixarLogVSetField(TIFF *tif,uint32_t tag,__va_list_tag *ap)

{
  uint uVar1;
  uint8_t *puVar2;
  int iVar3;
  tmsize_t tVar4;
  tmsize_t local_88;
  undefined4 *local_78;
  char *local_60;
  undefined4 *local_50;
  int local_34;
  int result;
  PixarLogState *sp;
  __va_list_tag *ap_local;
  uint32_t tag_local;
  TIFF *tif_local;
  
  puVar2 = tif->tif_data;
  if (tag == 0x1000d) {
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_78 = (undefined4 *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_78 = (undefined4 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_78 + 2;
    }
    *(undefined4 *)(puVar2 + 0x108) = *local_78;
    switch(*(undefined4 *)(puVar2 + 0x108)) {
    case 0:
    case 1:
      TIFFSetField(tif,0x102,8);
      TIFFSetField(tif,0x153,1);
      break;
    case 2:
      TIFFSetField(tif,0x102,0x10);
      TIFFSetField(tif,0x153,1);
      break;
    case 3:
      TIFFSetField(tif,0x102,0x10);
      TIFFSetField(tif,0x153,2);
      break;
    case 4:
      TIFFSetField(tif,0x102,0x10);
      TIFFSetField(tif,0x153,1);
      break;
    case 5:
      TIFFSetField(tif,0x102,0x20);
      TIFFSetField(tif,0x153,3);
    }
    if ((tif->tif_flags & 0x400) == 0) {
      local_88 = -1;
    }
    else {
      local_88 = TIFFTileSize(tif);
    }
    tif->tif_tilesize = local_88;
    tVar4 = TIFFScanlineSize(tif);
    tif->tif_scanlinesize = tVar4;
    local_34 = 1;
  }
  else {
    if (tag == 0x10016) {
      uVar1 = ap->gp_offset;
      if (uVar1 < 0x29) {
        local_50 = (undefined4 *)((long)(int)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        local_50 = (undefined4 *)ap->overflow_arg_area;
        ap->overflow_arg_area = local_50 + 2;
      }
      *(undefined4 *)(puVar2 + 0x10c) = *local_50;
      if (((tif->tif_mode != 0) && ((*(uint *)(puVar2 + 0x104) & 1) != 0)) &&
         (iVar3 = deflateParams((z_streamp)(puVar2 + 0x80),*(int *)(puVar2 + 0x10c),0), iVar3 != 0))
      {
        if (*(long *)(puVar2 + 0xb0) == 0) {
          local_60 = "(null)";
        }
        else {
          local_60 = *(char **)(puVar2 + 0xb0);
        }
        TIFFErrorExtR(tif,"PixarLogVSetField","ZLib error: %s",local_60);
        return 0;
      }
      return 1;
    }
    local_34 = (**(code **)(puVar2 + 0x118))(tif,tag,ap);
  }
  return local_34;
}

Assistant:

static int PixarLogVSetField(TIFF *tif, uint32_t tag, va_list ap)
{
    static const char module[] = "PixarLogVSetField";
    PixarLogState *sp = (PixarLogState *)tif->tif_data;
    int result;

    switch (tag)
    {
        case TIFFTAG_PIXARLOGQUALITY:
            sp->quality = (int)va_arg(ap, int);
            if (tif->tif_mode != O_RDONLY && (sp->state & PLSTATE_INIT))
            {
                if (deflateParams(&sp->stream, sp->quality,
                                  Z_DEFAULT_STRATEGY) != Z_OK)
                {
                    TIFFErrorExtR(tif, module, "ZLib error: %s",
                                  sp->stream.msg ? sp->stream.msg : "(null)");
                    return (0);
                }
            }
            return (1);
        case TIFFTAG_PIXARLOGDATAFMT:
            sp->user_datafmt = (int)va_arg(ap, int);
            /* Tweak the TIFF header so that the rest of libtiff knows what
             * size of data will be passed between app and library, and
             * assume that the app knows what it is doing and is not
             * confused by these header manipulations...
             */
            switch (sp->user_datafmt)
            {
                case PIXARLOGDATAFMT_8BIT:
                case PIXARLOGDATAFMT_8BITABGR:
                    TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, 8);
                    TIFFSetField(tif, TIFFTAG_SAMPLEFORMAT, SAMPLEFORMAT_UINT);
                    break;
                case PIXARLOGDATAFMT_11BITLOG:
                    TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, 16);
                    TIFFSetField(tif, TIFFTAG_SAMPLEFORMAT, SAMPLEFORMAT_UINT);
                    break;
                case PIXARLOGDATAFMT_12BITPICIO:
                    TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, 16);
                    TIFFSetField(tif, TIFFTAG_SAMPLEFORMAT, SAMPLEFORMAT_INT);
                    break;
                case PIXARLOGDATAFMT_16BIT:
                    TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, 16);
                    TIFFSetField(tif, TIFFTAG_SAMPLEFORMAT, SAMPLEFORMAT_UINT);
                    break;
                case PIXARLOGDATAFMT_FLOAT:
                    TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, 32);
                    TIFFSetField(tif, TIFFTAG_SAMPLEFORMAT,
                                 SAMPLEFORMAT_IEEEFP);
                    break;
            }
            /*
             * Must recalculate sizes should bits/sample change.
             */
            tif->tif_tilesize =
                isTiled(tif) ? TIFFTileSize(tif) : (tmsize_t)(-1);
            tif->tif_scanlinesize = TIFFScanlineSize(tif);
            result = 1; /* NB: pseudo tag */
            break;
        default:
            result = (*sp->vsetparent)(tif, tag, ap);
    }
    return (result);
}